

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void __thiscall ring_buffer<int>::push_back(ring_buffer<int> *this,int *value)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar1 = this->capacity;
  uVar2 = this->sz;
  if (uVar2 == uVar1) {
    this->first = (this->first + 1) % uVar2;
  }
  else {
    this->sz = uVar2 + 1;
  }
  sVar3 = this->pos;
  (this->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar3] = *value;
  this->pos = (sVar3 + 1) % uVar1;
  return;
}

Assistant:

void push_back(const T & value) {
        if (sz == capacity) {
            // advance the start when buffer is full
            first = (first + 1) % capacity;
        } else {
            sz++;
        }
        data[pos] = value;
        pos = (pos + 1) % capacity;
    }